

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O2

bool isZSH(void)

{
  char *__s;
  size_type sVar1;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __s = getenv("SHELL");
  if (__s != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_31);
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&local_30,"zsh",0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_dispose
              (&local_30);
    if (sVar1 != 0xffffffffffffffff) {
      return true;
    }
  }
  return false;
}

Assistant:

[[nodiscard]] static bool isZSH() {
  if (let *shell = std::getenv("SHELL"))
    if (std::string(shell).find("zsh") != std::string::npos)
      return true;

  return false;
}